

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::Mine::AddScalarDetectionCoefficientValue(Mine *this,KUINT8 SDC)

{
  KUINT8 local_11;
  Mine *pMStack_10;
  KUINT8 SDC_local;
  Mine *this_local;
  
  local_11 = SDC;
  pMStack_10 = this;
  MinefieldDataFilter::SetScalarDetectionCoefficient(&this->super_MinefieldDataFilter,true);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_vui8SDC,&local_11);
  return;
}

Assistant:

void Mine::AddScalarDetectionCoefficientValue( KUINT8 SDC )
{
    SetScalarDetectionCoefficient( true );
    m_vui8SDC.push_back( SDC );
}